

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_package_fake.hxx
# Opt level: O2

void __thiscall RaftPkg::~RaftPkg(RaftPkg *this)

{
  logger_wrapper *this_00;
  element_type *peVar1;
  
  this_00 = (this->myLogWrapper).super___shared_ptr<logger_wrapper,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (logger_wrapper *)0x0) {
    logger_wrapper::destroy(this_00);
  }
  peVar1 = (this->fNet).super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_rpc_client_factory)._vptr_rpc_client_factory[5])();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->raftServer).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->scheduler).
              super___shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->rpcCliFactory).
              super___shared_ptr<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->listener).super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->myLog).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->myLogWrapper).super___shared_ptr<logger_wrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sm).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sMgr).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fTimer).super___shared_ptr<nuraft::FakeTimer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fNet).super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->fBase).super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->myEndpoint);
  return;
}

Assistant:

~RaftPkg() {
        if (myLogWrapper) myLogWrapper->destroy();
        if (fNet) fNet->shutdown();
    }